

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_count.hpp
# Opt level: O0

void __thiscall
boost::detail::shared_count::
shared_count<PartialJPDPValuePair*,boost::detail::sp_ms_deleter<PartialJPDPValuePair>>
          (void *param_1)

{
  sp_counted_impl_pd<PartialJPDPValuePair_*,_boost::detail::sp_ms_deleter<PartialJPDPValuePair>_>
  *this;
  
  *(undefined8 *)param_1 = 0;
  this = (sp_counted_impl_pd<PartialJPDPValuePair_*,_boost::detail::sp_ms_deleter<PartialJPDPValuePair>_>
          *)operator_new(0x80);
  sp_counted_impl_pd<PartialJPDPValuePair_*,_boost::detail::sp_ms_deleter<PartialJPDPValuePair>_>::
  sp_counted_impl_pd(this,(PartialJPDPValuePair *)param_1);
  (((PartialJPDPValuePair *)param_1)->super_PartialJointPolicyValuePair).
  super_PartialPolicyPoolItemInterface._vptr_PartialPolicyPoolItemInterface = (_func_int **)this;
  return;
}

Assistant:

id_(shared_count_id)
#endif
    {
#ifndef BOOST_NO_EXCEPTIONS

        try
        {
            pi_ = new sp_counted_impl_pd< P, D >( p );
        }
        catch( ... )
        {
            D::operator_fn( p ); // delete p
            throw;
        }

#else

        pi_ = new sp_counted_impl_pd< P, D >( p );

        if( pi_ == 0 )
        {
            D::operator_fn( p ); // delete p
            boost::throw_exception( std::bad_alloc() );
        }

#endif // #ifndef BOOST_NO_EXCEPTIONS
    }